

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sema.h
# Opt level: O2

bool __thiscall phaeton::Sema::is_in_inputs(Sema *this,string *Name)

{
  pointer ppSVar1;
  pointer ppSVar2;
  Symbol *pSVar3;
  pointer ppSVar4;
  
  pSVar3 = getSymbol(this,Name);
  ppSVar1 = (this->Inputs).
            super__Vector_base<const_phaeton::Symbol_*,_std::allocator<const_phaeton::Symbol_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppSVar2 = (this->Inputs).
            super__Vector_base<const_phaeton::Symbol_*,_std::allocator<const_phaeton::Symbol_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    ppSVar4 = ppSVar2;
    if (ppSVar4 == ppSVar1) break;
    ppSVar2 = ppSVar4 + 1;
  } while (*ppSVar4 != pSVar3);
  return ppSVar4 != ppSVar1;
}

Assistant:

bool is_in_inputs(const std::string &Name) const {
    const Symbol *Sym = getSymbol(Name);
    for (auto s : Inputs) {
      if (s == Sym)
        return true;
    }
    return false;
  }